

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

void stbtt_MakeGlyphBitmapSubpixel
               (stbtt_fontinfo *info,uchar *output,int out_w,int out_h,int out_stride,float scale_x,
               float scale_y,float shift_x,float shift_y,int glyph)

{
  void *in_stack_ffffffffffffff88;
  undefined1 local_70 [8];
  stbtt__bitmap gbm;
  stbtt_vertex *vertices;
  int ix0;
  int iy0;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  ix0 = out_stride;
  local_40 = shift_y;
  local_3c = shift_x;
  local_38 = scale_y;
  local_34 = scale_x;
  iy0 = stbtt_GetGlyphShape(info,glyph,(stbtt_vertex **)&gbm.pixels);
  stbtt_GetGlyphBitmapBoxSubpixel
            (info,glyph,local_34,local_38,local_3c,local_40,(int *)&vertices,
             (int *)((long)&vertices + 4),(int *)0x0,(int *)0x0);
  gbm.w = ix0;
  local_70._0_4_ = out_w;
  local_70._4_4_ = out_h;
  gbm._8_8_ = output;
  if (out_h != 0 && out_w != 0) {
    stbtt_Rasterize((stbtt__bitmap *)local_70,0.35,(stbtt_vertex *)gbm.pixels,iy0,local_34,local_38,
                    local_3c,local_40,(int)vertices,vertices._4_4_,1,in_stack_ffffffffffffff88);
  }
  free(gbm.pixels);
  return;
}

Assistant:

STBTT_DEF void stbtt_MakeGlyphBitmapSubpixel(const stbtt_fontinfo *info, unsigned char *output, int out_w, int out_h, int out_stride, float scale_x, float scale_y, float shift_x, float shift_y, int glyph)
{
   int ix0,iy0;
   stbtt_vertex *vertices;
   int num_verts = stbtt_GetGlyphShape(info, glyph, &vertices);
   stbtt__bitmap gbm;   

   stbtt_GetGlyphBitmapBoxSubpixel(info, glyph, scale_x, scale_y, shift_x, shift_y, &ix0,&iy0,0,0);
   gbm.pixels = output;
   gbm.w = out_w;
   gbm.h = out_h;
   gbm.stride = out_stride;

   if (gbm.w && gbm.h)
      stbtt_Rasterize(&gbm, 0.35f, vertices, num_verts, scale_x, scale_y, shift_x, shift_y, ix0,iy0, 1, info->userdata);

   STBTT_free(vertices, info->userdata);
}